

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

void __thiscall QPDFCryptoProvider::QPDFCryptoProvider(QPDFCryptoProvider *this)

{
  bool bVar1;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string default_crypto;
  allocator<char> local_31;
  string local_30;
  QPDFCryptoProvider *local_10;
  QPDFCryptoProvider *this_local;
  
  local_10 = this;
  std::make_shared<QPDFCryptoProvider::Members>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"openssl",&local_31);
  std::function<std::shared_ptr<QPDFCryptoImpl>()>::
  function<std::shared_ptr<QPDFCrypto_openssl>(&)(),void>
            ((function<std::shared_ptr<QPDFCryptoImpl>()> *)
             (default_crypto.field_2._M_local_buf + 8),std::make_shared<QPDFCrypto_openssl>);
  registerImpl_internal(this,&local_30,(provider_fn *)(default_crypto.field_2._M_local_buf + 8));
  std::function<std::shared_ptr<QPDFCryptoImpl>_()>::~function
            ((function<std::shared_ptr<QPDFCryptoImpl>_()> *)((long)&default_crypto.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"QPDF_CRYPTO_PROVIDER",&local_a9);
  bVar1 = QUtil::get_env(&local_a8,(string *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_88,"openssl");
  }
  setDefaultProvider_internal(this,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

QPDFCryptoProvider::QPDFCryptoProvider() :
    m(std::make_shared<Members>())
{
#ifdef USE_CRYPTO_NATIVE
    registerImpl_internal("native", std::make_shared<QPDFCrypto_native>);
#endif
#ifdef USE_CRYPTO_GNUTLS
    registerImpl_internal("gnutls", std::make_shared<QPDFCrypto_gnutls>);
#endif
#ifdef USE_CRYPTO_OPENSSL
    registerImpl_internal("openssl", std::make_shared<QPDFCrypto_openssl>);
#endif
    std::string default_crypto;
    if (!QUtil::get_env("QPDF_CRYPTO_PROVIDER", &default_crypto)) {
        default_crypto = DEFAULT_CRYPTO;
    }
    setDefaultProvider_internal(default_crypto);
}